

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

double __thiscall
HighsSearch::checkSol
          (HighsSearch *this,vector<double,_std::allocator<double>_> *sol,bool *integerfeasible)

{
  double *pdVar1;
  uint uVar2;
  HighsMipSolver *pHVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  pointer pdVar6;
  byte bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  *integerfeasible = true;
  pHVar3 = this->mipsolver;
  pHVar4 = pHVar3->model_;
  uVar2 = pHVar4->num_col_;
  if ((ulong)uVar2 == 0) {
    dVar12 = 0.0;
  }
  else {
    bVar7 = *integerfeasible;
    pdVar5 = (sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pHVar4->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    dVar12 = 0.0;
    dVar9 = 0.0;
    do {
      dVar11 = pdVar5[uVar8];
      dVar13 = pdVar6[uVar8] * dVar11;
      if (((bVar7 & 1) != 0) &&
         ((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8] == kInteger)) {
        dVar10 = round(dVar11);
        pdVar1 = &((pHVar3->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (*pdVar1 <= ABS(dVar11 - dVar10) && ABS(dVar11 - dVar10) != *pdVar1) {
          *integerfeasible = false;
          bVar7 = 0;
        }
      }
      dVar11 = dVar9 + dVar13;
      dVar12 = dVar12 + (dVar9 - (dVar11 - dVar13)) + (dVar13 - (dVar11 - (dVar11 - dVar13)));
      uVar8 = uVar8 + 1;
      dVar9 = dVar11;
    } while (uVar2 != uVar8);
    dVar12 = dVar12 + dVar11;
  }
  return dVar12;
}

Assistant:

double HighsSearch::checkSol(const std::vector<double>& sol,
                             bool& integerfeasible) const {
  HighsCDouble objval = 0.0;
  integerfeasible = true;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    objval += sol[i] * mipsolver.colCost(i);
    assert(std::isfinite(sol[i]));

    if (!integerfeasible || mipsolver.variableType(i) != HighsVarType::kInteger)
      continue;

    if (fractionality(sol[i]) > mipsolver.mipdata_->feastol) {
      integerfeasible = false;
    }
  }

  return double(objval);
}